

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O0

int Aig_ManVerifyUsingBdds(Aig_Man_t *pInit,Saig_ParBbr_t *pPars)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  Aig_Man_t *p_00;
  Vec_Int_t *p_01;
  void *pvVar4;
  Abc_Cex_t *pAVar5;
  int local_5c;
  int RetValue;
  int iBitNew;
  int iBitOld;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vInputMap;
  Aig_Obj_t *pObj;
  Aig_Man_t *p;
  Abc_Cex_t *pCexNew;
  Abc_Cex_t *pCexOld;
  Saig_ParBbr_t *pPars_local;
  Aig_Man_t *pInit_local;
  
  for (Entry = 0; iVar2 = Saig_ManPiNum(pInit), Entry < iVar2; Entry = Entry + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pInit->vCis,Entry);
    iVar2 = Aig_ObjRefs(pObj_00);
    if (iVar2 == 0) break;
  }
  iVar2 = Saig_ManPiNum(pInit);
  if (Entry == iVar2) {
    pInit_local._4_4_ = Aig_ManVerifyUsingBdds_int(pInit,pPars);
  }
  else {
    p_00 = Aig_ManDupTrim(pInit);
    iVar2 = Aig_ManCiNum(p_00);
    iVar3 = Aig_ManCiNum(pInit);
    if (iVar3 <= iVar2) {
      __assert_fail("Aig_ManCiNum(p) < Aig_ManCiNum(pInit)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                    ,0x230,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
    }
    iVar2 = Aig_ManRegNum(p_00);
    iVar3 = Aig_ManRegNum(pInit);
    if (iVar2 != iVar3) {
      __assert_fail("Aig_ManRegNum(p) == Aig_ManRegNum(pInit)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                    ,0x231,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
    }
    pInit_local._4_4_ = Aig_ManVerifyUsingBdds_int(p_00,pPars);
    if (pInit_local._4_4_ == 0) {
      pAVar1 = p_00->pSeqModel;
      if (pAVar1 == (Abc_Cex_t *)0x0) {
        __assert_fail("pCexOld != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                      ,0x23a,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
      }
      iVar2 = Saig_ManPiNum(pInit);
      p_01 = Vec_IntAlloc(iVar2);
      for (Entry = 0; iVar2 = Saig_ManPiNum(pInit), Entry < iVar2; Entry = Entry + 1) {
        pvVar4 = Vec_PtrEntry(pInit->vCis,Entry);
        if (*(long *)((long)pvVar4 + 0x28) == 0) {
          Vec_IntPush(p_01,-1);
        }
        else {
          iVar2 = Aig_ObjCioId(*(Aig_Obj_t **)((long)pvVar4 + 0x28));
          Vec_IntPush(p_01,iVar2);
        }
      }
      iVar2 = Saig_ManRegNum(pInit);
      iVar3 = Saig_ManPiNum(pInit);
      pAVar5 = Abc_CexAlloc(iVar2,iVar3,pAVar1->iFrame + 1);
      pAVar5->iFrame = pAVar1->iFrame;
      pAVar5->iPo = pAVar1->iPo;
      for (RetValue = 0; RetValue < pAVar1->nRegs; RetValue = RetValue + 1) {
        iVar2 = Abc_InfoHasBit((uint *)(pAVar1 + 1),RetValue);
        if (iVar2 != 0) {
          Abc_InfoSetBit((uint *)(pAVar5 + 1),RetValue);
        }
      }
      local_5c = RetValue;
      for (Entry = 0; Entry <= pAVar5->iFrame; Entry = Entry + 1) {
        for (iBitOld = 0; iVar2 = Vec_IntSize(p_01), iBitOld < iVar2; iBitOld = iBitOld + 1) {
          iVar2 = Vec_IntEntry(p_01,iBitOld);
          if ((iVar2 != -1) &&
             (iVar2 = Abc_InfoHasBit((uint *)(pAVar1 + 1),RetValue + iVar2), iVar2 != 0)) {
            Abc_InfoSetBit((uint *)(pAVar5 + 1),local_5c + iBitOld);
          }
        }
        iVar2 = Saig_ManPiNum(p_00);
        RetValue = iVar2 + RetValue;
        iVar2 = Saig_ManPiNum(pInit);
        local_5c = iVar2 + local_5c;
      }
      if (local_5c <= RetValue) {
        __assert_fail("iBitOld < iBitNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                      ,600,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
      }
      if (RetValue != pAVar1->nBits) {
        __assert_fail("iBitOld == pCexOld->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                      ,0x259,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
      }
      if (local_5c != pAVar5->nBits) {
        __assert_fail("iBitNew == pCexNew->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                      ,0x25a,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
      }
      Vec_IntFree(p_01);
      pInit->pSeqModel = pAVar5;
      Aig_ManStop(p_00);
      pInit_local._4_4_ = 0;
    }
    else {
      Aig_ManStop(p_00);
    }
  }
  return pInit_local._4_4_;
}

Assistant:

int Aig_ManVerifyUsingBdds( Aig_Man_t * pInit, Saig_ParBbr_t * pPars )
{
    Abc_Cex_t * pCexOld, * pCexNew;
    Aig_Man_t * p;
    Aig_Obj_t * pObj;
    Vec_Int_t * vInputMap;
    int i, k, Entry, iBitOld, iBitNew, RetValue;
//    pPars->fVerbose = 1;
    // check if there are PIs without fanout
    Saig_ManForEachPi( pInit, pObj, i )
        if ( Aig_ObjRefs(pObj) == 0 )
            break;
    if ( i == Saig_ManPiNum(pInit) )
        return Aig_ManVerifyUsingBdds_int( pInit, pPars );
    // create new AIG
    p = Aig_ManDupTrim( pInit );
    assert( Aig_ManCiNum(p) < Aig_ManCiNum(pInit) );
    assert( Aig_ManRegNum(p) == Aig_ManRegNum(pInit) );
    RetValue = Aig_ManVerifyUsingBdds_int( p, pPars );
    if ( RetValue != 0 )
    {
        Aig_ManStop( p );
        return RetValue;
    }
    // the problem is satisfiable - remap the pattern
    pCexOld = p->pSeqModel;
    assert( pCexOld != NULL );
    // create input map
    vInputMap = Vec_IntAlloc( Saig_ManPiNum(pInit) );
    Saig_ManForEachPi( pInit, pObj, i )
        if ( pObj->pData != NULL )
            Vec_IntPush( vInputMap, Aig_ObjCioId((Aig_Obj_t *)pObj->pData) );
        else
            Vec_IntPush( vInputMap, -1 );
    // create new pattern
    pCexNew = Abc_CexAlloc( Saig_ManRegNum(pInit), Saig_ManPiNum(pInit), pCexOld->iFrame+1 );
    pCexNew->iFrame = pCexOld->iFrame;
    pCexNew->iPo    = pCexOld->iPo;
    // copy the bit-data
    for ( iBitOld = 0; iBitOld < pCexOld->nRegs; iBitOld++ )
        if ( Abc_InfoHasBit( pCexOld->pData, iBitOld ) )
            Abc_InfoSetBit( pCexNew->pData, iBitOld );
    // copy the primary input data
    iBitNew = iBitOld;
    for ( i = 0; i <= pCexNew->iFrame; i++ )
    {
        Vec_IntForEachEntry( vInputMap, Entry, k )
        {
            if ( Entry == -1 )
                continue;
            if ( Abc_InfoHasBit( pCexOld->pData, iBitOld + Entry ) )
                Abc_InfoSetBit( pCexNew->pData, iBitNew + k );
        }
        iBitOld += Saig_ManPiNum(p);
        iBitNew += Saig_ManPiNum(pInit);
    }
    assert( iBitOld < iBitNew );
    assert( iBitOld == pCexOld->nBits );
    assert( iBitNew == pCexNew->nBits );
    Vec_IntFree( vInputMap );
    pInit->pSeqModel = pCexNew;
    Aig_ManStop( p );
    return 0;
}